

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islist.h
# Opt level: O0

void __thiscall
soplex::IsList<soplex::SVSetBase<double>::DLPSV>::clear
          (IsList<soplex::SVSetBase<double>::DLPSV> *this,bool pDestroyElements)

{
  DLPSV *this_00;
  byte in_SIL;
  DLPSV *in_RDI;
  DLPSV *it;
  DLPSV *nextElement;
  
  if ((in_SIL & 1) != 0) {
    this_00 = (DLPSV *)(in_RDI->super_SVectorBase<double>).m_elem;
    while (this_00 != (DLPSV *)0x0) {
      this_00 = next((IsList<soplex::SVSetBase<double>::DLPSV> *)this_00,in_RDI);
      spx_free<soplex::SVSetBase<double>::DLPSV*>((DLPSV **)0x262763);
    }
  }
  (in_RDI->super_SVectorBase<double>).memsize = 0;
  (in_RDI->super_SVectorBase<double>).memused = 0;
  (in_RDI->super_SVectorBase<double>).m_elem = (Nonzero<double> *)0x0;
  return;
}

Assistant:

void clear(bool pDestroyElements = false)
   {
      if(pDestroyElements)
      {
         T* nextElement;

         for(T* it = the_first; it; it = nextElement)
         {
            nextElement = next(it);
            it->~T();
            spx_free(it);
         }
      }

      the_first = the_last = nullptr;
   }